

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O2

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:82:72)>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  stream_core *psVar1;
  duration dVar2;
  undefined1 auVar3 [16];
  want wVar4;
  type *handler;
  ulong uVar5;
  error_code *extraout_RDX;
  error_code *extraout_RDX_00;
  error_code *ec_00;
  steady_timer *this_00;
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
  *this_01;
  basic_stream_socket<asio::ip::tcp> *this_02;
  ulong uVar6;
  size_t sVar7;
  const_buffer cVar8;
  undefined1 local_c0 [128];
  error_code local_40;
  
  this->start_ = start;
  uVar6 = bytes_transferred;
  sVar7 = bytes_transferred;
  if (start != 1) goto LAB_0011a368;
  do {
    bytes_transferred = (size_t)&this->bytes_transferred_;
    wVar4 = handshake_op::operator()
                      (&this->op_,&this->core_->engine_,&this->ec_,(size_t *)bytes_transferred);
    this->want_ = wVar4;
    if (wVar4 == want_input_and_retry) {
      psVar1 = this->core_;
      if ((psVar1->input_).size_ == 0) {
        this_01 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                   *)&psVar1->pending_read_;
        if ((psVar1->pending_read_).
            super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
            .implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_c0._0_8_ = 0x7fffffffffffffff;
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                        *)this_01,(time_point *)local_c0);
          this_02 = this->next_layer_;
          local_c0._0_8_ = (this->core_->input_buffer_).data_;
          local_c0._8_8_ = (void *)(this->core_->input_buffer_).size_;
          goto LAB_0011a582;
        }
        goto LAB_0011a55d;
      }
      cVar8 = engine::put_input(&psVar1->engine_,&psVar1->input_);
      bytes_transferred = (size_t)this->core_;
      ((stream_core *)bytes_transferred)->input_ = cVar8;
    }
    else {
      if ((wVar4 == want_output_and_retry) || (wVar4 == want_output)) {
        this_01 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                   *)&this->core_->pending_write_;
        if ((this->core_->pending_write_).
            super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
            .implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_c0._0_8_ = 0x7fffffffffffffff;
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                        *)this_01,(time_point *)local_c0);
          dVar2.__r = (rep)this->next_layer_;
          local_c0._8_16_ =
               (undefined1  [16])
               engine::get_output(&this->core_->engine_,&this->core_->output_buffer_);
          local_c0._24_8_ = 0;
          local_c0._32_4_ = 0;
          local_c0._0_8_ = dVar2.__r;
          io_op((io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>
                 *)(local_c0 + 0x28),this);
          local_40._M_value = 0;
          local_40._M_cat = (error_category *)std::_V2::system_category();
          asio::detail::
          write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ListenerImpl.cpp:82:72)>_>
          ::operator()((write_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ListenerImpl_cpp:82:72)>_>
                        *)local_c0,&local_40,0,1);
          SL::WS_LITE::
          async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)
          ::$_0::~__0((__0 *)(local_c0 + 0x60));
          return;
        }
LAB_0011a55d:
        basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
        ::
        async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (this_01,this);
        return;
      }
      sVar7 = uVar6;
      if (start != 0) {
        this_02 = this->next_layer_;
        local_c0._0_8_ = (this->core_->input_buffer_).data_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_c0._16_8_;
        local_c0._8_16_ = auVar3 << 0x40;
LAB_0011a582:
        basic_stream_socket<asio::ip::tcp>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>>
                  (this_02,(mutable_buffers_1 *)local_c0,this);
        return;
      }
LAB_0011a368:
      uVar6 = 0;
      if ((sVar7 != 0xffffffffffffffff) && (uVar6 = sVar7, (this->ec_)._M_value == 0)) {
        (this->ec_)._M_value = ec._M_value;
        (this->ec_)._M_cat = ec._M_cat;
      }
      wVar4 = this->want_;
      if (wVar4 == want_input_and_retry) {
        psVar1 = this->core_;
        uVar5 = (psVar1->input_buffer_).size_;
        if (uVar6 <= uVar5) {
          uVar5 = uVar6;
        }
        (psVar1->input_).data_ = (psVar1->input_buffer_).data_;
        (psVar1->input_).size_ = uVar5;
        cVar8 = engine::put_input(&this->core_->engine_,&this->core_->input_);
        bytes_transferred = (size_t)this->core_;
        ((stream_core *)bytes_transferred)->input_ = cVar8;
        this_00 = &this->core_->pending_read_;
      }
      else {
        if (wVar4 != want_output_and_retry) {
          if (wVar4 == want_output) {
            local_c0._0_8_ = -0x8000000000000000;
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::expires_at(&this->core_->pending_write_,(time_point *)local_c0);
          }
          handler = (type *)engine::map_error_code(&this->core_->engine_,&this->ec_);
          ec_00 = extraout_RDX_00;
          goto LAB_0011a51d;
        }
        this_00 = &this->core_->pending_write_;
      }
      local_c0._0_8_ = -0x8000000000000000;
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
      ::expires_at(this_00,(time_point *)local_c0);
    }
  } while ((this->ec_)._M_value == 0);
  handler = (type *)engine::map_error_code(&this->core_->engine_,&this->ec_);
  ec_00 = extraout_RDX;
LAB_0011a51d:
  handshake_op::
  call_handler<SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>)::__0>
            ((handshake_op *)&this->handler_,handler,ec_00,(size_t *)bytes_transferred);
  return;
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }